

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::RsElseClauseSyntax::setChild
          (RsElseClauseSyntax *this,size_t index,TokenOrSyntax child)

{
  Info *pIVar1;
  undefined1 uVar2;
  NumericTokenFlags NVar3;
  uint32_t uVar4;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar5;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar6;
  RsProdItemSyntax *pRVar7;
  
  if (index == 0) {
    pvVar6 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar2 = pvVar6->field_0x2;
    NVar3.raw = (pvVar6->numFlags).raw;
    uVar4 = pvVar6->rawLen;
    pIVar1 = pvVar6->info;
    (this->keyword).kind = pvVar6->kind;
    (this->keyword).field_0x2 = uVar2;
    (this->keyword).numFlags = (NumericTokenFlags)NVar3.raw;
    (this->keyword).rawLen = uVar4;
    (this->keyword).info = pIVar1;
  }
  else {
    ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar5 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pRVar7 = (RsProdItemSyntax *)0x0;
    }
    else {
      ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pRVar7 = (RsProdItemSyntax *)*ppSVar5;
    }
    (this->item).ptr = pRVar7;
  }
  return;
}

Assistant:

void RsElseClauseSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: keyword = child.token(); return;
        case 1: item = child.node() ? &child.node()->as<RsProdItemSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}